

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

string * lightconf::escape_string(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  uchar c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  char utf8 [7];
  char *table;
  string *str_local;
  string *buf;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_40._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0), bVar2) {
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1);
    bVar1 = *pbVar3;
    if (bVar1 == 8) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (bVar1 == 9) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (bVar1 == 10) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (bVar1 == 0xc) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (bVar1 == 0xd) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (bVar1 == 0x22) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (bVar1 == 0x2f) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (bVar1 == 0x5c) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if ((bVar1 < 0x20) || (bVar1 == 0x7f)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape_string(const std::string& str) {
    const char *table = "0123456789abcdef";
    char utf8[7] = "\\u0000";
    std::string buf;

    for (unsigned char c : str) {
        switch (c) {
        case '\r': buf.append("\\r"); break;
        case '\n': buf.append("\\n"); break;
        case '\\': buf.append("\\\\"); break;
        case '/':  buf.append("\\/"); break;
        case '"':  buf.append("\\\""); break;
        case '\f': buf.append("\\f"); break;
        case '\b': buf.append("\\b"); break;
        case '\t': buf.append("\\t"); break;
        default:
            if (c < 0x20 || c == 0x7f) {
                utf8[4] = table[c >> 4];
                utf8[5] = table[c & 0xf];
                buf.append(utf8);
            } else {
                buf.append(1, c);
            }
        }
    }

    return buf;
}